

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpMap<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  NodeBase *pNVar7;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
  *pOVar8;
  code *pcVar9;
  uint uVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 data_00;
  ParseContext *ctx_00;
  uint *puVar11;
  int *failure_msg;
  Nonnull<const_char_*> failure_msg_00;
  ulong uVar12;
  undefined8 uVar13;
  long lVar14;
  uint7 uVar15;
  int iVar16;
  undefined8 extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *ctx_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  ParseContext *extraout_RDX_05;
  ParseContext *extraout_RDX_06;
  ParseContext *extraout_RDX_07;
  ParseContext *extraout_RDX_08;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 this;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar17;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar18;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 msg_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar19;
  char *pcVar20;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar21;
  uint64_t uVar22;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  MapFieldBaseForParse *target;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar23;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar24;
  pair<const_char_*,_int> pVar25;
  pair<const_char_*,_int> pVar26;
  FieldAux *aux;
  undefined1 local_c8 [31];
  byte local_a9;
  TcParseTableBase *local_a8;
  uint64_t local_a0;
  MessageLite *local_98;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_90;
  long local_88;
  undefined1 local_60 [8];
  ulong local_58;
  uint *local_50;
  
  paVar17 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_c8;
  puVar11 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  local_a0 = hasbits;
  local_90 = data.field_0;
  if (((ulong)puVar11 & 3) != 0) {
LAB_00450255:
    *(undefined8 *)((long)paVar17 + -8) = 0x45025a;
    AlignFail();
  }
  local_88 = (long)&table->has_bits_offset +
             (ulong)(ushort)puVar11[2] * 8 + (ulong)table->aux_offset;
  local_a9 = *(byte *)(local_88 + 4);
  if (((local_a9 & 1) == 0) || ((data.field_0._0_4_ & 7) != 2)) {
    pcVar20 = MpFallback(msg,ptr,ctx,data,table,hasbits);
    return pcVar20;
  }
  uVar4 = *(undefined4 *)
           ((long)&table->has_bits_offset + (ulong)(ushort)puVar11[2] * 8 + (ulong)table->aux_offset
           );
  aVar23.data = (long)&msg->_vptr_MessageLite + (ulong)*puVar11;
  local_a8 = table;
  local_98 = msg;
  local_50 = puVar11;
  if ((local_a9 & 2) == 0) {
    if ((aVar23.data & 7) != 0) {
LAB_0045025a:
      AlignFail(aVar23.data);
    }
    if ((*(ulong *)aVar23 & 1) != 0) {
      (*MapFieldBaseForParse::sync_map_with_repeated)(aVar23.data,1);
    }
    aVar23.data = aVar23.data + 0x10;
  }
  else if ((aVar23.data & 7) != 0) goto LAB_0045025a;
  local_58 = (ulong)CONCAT14(local_a9,uVar4);
  msg_00.data = (uint64_t)local_60;
  paVar17 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_c8;
  do {
    pcVar20._2_6_ = 0;
    pcVar20._0_2_ = *(ushort *)(aVar23.data + 0xc);
    paVar17[-1].data = 0x44fdf5;
    data_00.data = (uint64_t)UntypedMapBase::AllocNode(aVar23.data,(size_t)pcVar20);
    uVar3 = *(ushort *)(aVar23.data + 0xc);
    uVar12 = (ulong)uVar3 - 8;
    if (uVar12 < 8) {
      pcVar20 = &DAT_00000008;
      paVar17[-1].data = 0x45003d;
      failure_msg_00 =
           absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                     (uVar12,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
    }
    else {
      failure_msg_00 = (Nonnull<const_char_*>)0x0;
    }
    if (failure_msg_00 != (Nonnull<const_char_*>)0x0) {
      pcVar20 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      iVar16 = 0xb2c;
LAB_004502a5:
      paVar17[-1].data = 0x4502ad;
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)(paVar17 + 9),pcVar20,iVar16,failure_msg_00);
      paVar17[-1].data = 0x4502b5;
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)(paVar17 + 9));
    }
    *(char **)(data_00.data + 8) = (char *)0x0;
    *(undefined8 *)((long)(data_00.data - 8) + (ulong)uVar3) = 0;
    paVar17[0x10].data = (uint64_t)aVar23;
    paVar17[0xd].data = (uint64_t)data_00;
    paVar17[9].data = (uint64_t)aVar23;
    this.data = (uint64_t)(paVar17 + 0x10);
    paVar17[10].data = (uint64_t)this;
    paVar17[0xb].data = (uint64_t)msg_00;
    paVar17[2].data = (uint64_t)msg_00;
    *paVar17 = paVar17[9];
    paVar17[1] = paVar17[10];
    paVar17[-1].data = 0x44fe5b;
    UntypedMapBase::
    VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)aVar23,*(anon_class_24_3_6b4a22af *)paVar17);
    paVar17[0x10].data = (uint64_t)aVar23;
    paVar17[0x11].data = (uint64_t)(paVar17 + 8);
    paVar17[0x12].data = (uint64_t)aVar23;
    paVar17[0xd].data = (uint64_t)data_00;
    paVar17[9].data = (uint64_t)aVar23;
    paVar17[10].data = (uint64_t)this;
    paVar17[0xb].data = (uint64_t)msg_00;
    paVar17[2].data = (uint64_t)msg_00;
    *paVar17 = paVar17[9];
    paVar17[1] = paVar17[10];
    paVar17[-1].data = 0x44fea2;
    aVar19 = aVar23;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)aVar23,*(anon_class_24_3_6b4a22af *)paVar17);
    bVar1 = *ptr;
    aVar21.data._1_7_ = 0;
    aVar21.data._0_1_ = bVar1;
    if ((char)bVar1 < '\0') {
      pcVar20._4_4_ = 0;
      pcVar20._0_4_ = CONCAT31(0,bVar1);
      paVar17[-1].data = 0x44feba;
      pVar25 = ReadSizeFallback(ptr,CONCAT31(0,bVar1));
      aVar21.data = pVar25._8_8_ & 0xffffffff;
    }
    else {
      pVar25._8_8_ = extraout_RDX;
      pVar25.first = (char *)((long)ptr + 1);
      ptr = (char *)aVar19;
    }
    ctx_01 = pVar25._8_8_;
    aVar19.data = (uint64_t)pVar25.first;
    if (((EpsCopyInputStream *)aVar19.data == (EpsCopyInputStream *)0x0) ||
       (*(int *)((long)ctx + 0x58) < 1)) {
      aVar19.data = 0;
    }
    else {
      ptr = (char *)(paVar17 + 9);
      paVar17[-1].data = 0x44fedb;
      pcVar20 = (char *)ctx;
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)ptr,(char *)ctx,(int)pVar25.first);
      *(undefined4 *)((long)paVar17 + 100) = *(undefined4 *)(paVar17 + 9);
      *(int *)((long)ctx + 0x58U) = *(int *)((long)ctx + 0x58U) + -1;
      ctx_01 = extraout_RDX_00;
    }
    if ((EpsCopyInputStream *)aVar19.data == (EpsCopyInputStream *)0x0) {
LAB_0044ff60:
      ctx_00 = (ParseContext *)0x0;
    }
    else {
      iVar16 = *(int *)((long)ctx + 0x58);
      this = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)iVar16;
      aVar21 = paVar17[8];
      paVar17->data = (uint64_t)aVar23;
      table = *(TcParseTableBase **)(paVar17 + 4);
      hasbits = *(uint64_t *)(paVar17 + 0xf);
      paVar17[-1].data = 0x44ff16;
      ptr = (char *)data_00;
      ctx_00 = (ParseContext *)
               ParseOneMapEntry((NodeBase *)data_00,(char *)aVar19,ctx,(FieldAux *)aVar21,table,
                                (FieldEntry *)hasbits,*(UntypedMapBase **)paVar17);
      ctx_01 = extraout_RDX_01;
      if (ctx_00 != (ParseContext *)0x0) {
        aVar19 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*(int *)((long)ctx + 0x58);
        if (iVar16 == *(int *)((long)ctx + 0x58)) {
          failure_msg_00 = (Nonnull<const_char_*>)0x0;
        }
        else {
          paVar17[-1].data = 0x4500b0;
          ptr = (char *)this;
          failure_msg_00 =
               absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (this.data,aVar19.data,"old_depth == depth_");
          ctx_01 = extraout_RDX_02;
        }
        if (failure_msg_00 != (Nonnull<const_char_*>)0x0) {
          pcVar20 = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
          ;
          iVar16 = 0x481;
          goto LAB_004502a5;
        }
      }
      *(int *)((long)ctx + 0x58U) = *(int *)((long)ctx + 0x58U) + 1;
      uVar10 = *(int *)((long)ctx + 0x1c) + *(int *)((long)paVar17 + 100);
      *(uint *)((long)ctx + 0x1c) = uVar10;
      pcVar20 = (char *)aVar19;
      if (*(int *)((long)ctx + 0x50) != 0) goto LAB_0044ff60;
      aVar21._0_4_ = (int)uVar10 >> 0x1f & uVar10;
      aVar21.data._4_4_ = 0;
      *(long *)ctx = (long)(int)aVar21._0_4_ + *(long *)((long)ctx + 8);
    }
    if (ctx_00 == (ParseContext *)0x0) {
      if (*(long *)(aVar23.data + 0x18) == 0) {
        paVar17[-1].data = 0x4501f0;
        UntypedMapBase::DeleteNode((UntypedMapBase *)aVar23,(NodeBase *)data_00);
        ctx_01 = extraout_RDX_03;
        pcVar20 = (char *)data_00;
      }
      pcVar20 = Error((MessageLite *)paVar17[6],pcVar20,ctx_01,(TcFieldData)aVar21,
                      (TcParseTableBase *)paVar17[4],(uint64_t)paVar17[5].data);
      return pcVar20;
    }
    if ((*(byte *)((long)paVar17 + 0x1f) & 0x10) != 0) {
      paVar17[-1].data = 0x44ff7e;
      puVar11 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)aVar23,(NodeBase *)data_00);
      uVar10 = *puVar11;
      pNVar7 = ((NodeBase **)paVar17[8].data)[1];
      pcVar20 = (char *)(long)(short)*(uint *)&pNVar7->next;
      ptr._0_4_ = *(uint *)&pNVar7->next >> 0x10;
      ptr._4_4_ = 0;
      ctx_01 = (ParseContext *)(((long)(int)uVar10 - (long)pcVar20) - (long)ptr);
      if ((EpsCopyInputStream *)((long)(int)uVar10 - (long)pcVar20) < ptr) goto LAB_0044ffa4;
      uVar5 = *(uint *)((long)&pNVar7->next + 4);
      pcVar20._4_4_ = 0;
      pcVar20._0_4_ = uVar5;
      ptr._2_6_ = 0;
      ptr._0_2_ = (ushort)uVar5;
      if (ptr <= ctx_01) {
        ctx_01 = (ParseContext *)(ulong)(uVar5 >> 0x10);
        aVar21.data = 0;
        do {
          pcVar20 = (char *)aVar21;
          ptr._1_7_ = (undefined7)((ulong)ptr >> 8);
          ptr._0_1_ = pcVar20 < ctx_01;
          if (pcVar20 >= ctx_01) goto LAB_00450074;
          uVar6 = *(uint *)((long)&pNVar7[1].next + (long)pcVar20 * 4 + (ulong)(uVar5 >> 3 & 0x1ffc)
                           );
          ptr._4_4_ = 0;
          ptr._0_4_ = uVar6;
          hasbits._1_7_ = 0;
          hasbits._0_1_ = (int)uVar10 < (int)uVar6;
          table = (TcParseTableBase *)(((long)pcVar20 * 2 - hasbits) + 2);
          aVar21.data = (uint64_t)table;
        } while (uVar6 != uVar10);
        goto LAB_0044ffa4;
      }
      ptr._1_1_ = (char)(uVar5 >> 8);
      ptr._0_1_ = (*(uint *)((long)&pNVar7[1].next + ((ulong)ctx_01 >> 5) * 4) >>
                   ((uint)ctx_01 & 0x1f) & 1) != 0;
      ptr._2_6_ = 0;
LAB_00450074:
      if ((char)ptr != '\0') goto LAB_0044ffa4;
      hasbits = paVar17[0xe].data;
      paVar17[-1].data = 0x45009c;
      WriteMapEntryAsUnknown
                ((MessageLite *)paVar17[6],(TcParseTableBase *)paVar17[4],(UntypedMapBase *)aVar23,
                 (uint32_t)
                 (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                  *)paVar17[7].data,(NodeBase *)data_00,SUB85(hasbits,0));
      goto LAB_0044fffe;
    }
LAB_0044ffa4:
    if (5 < ((byte)(*(uint *)(aVar23.data + 0xc) >> 0x18) & 0xf)) {
switchD_0044ffca_caseD_3:
      *(undefined8 *)((long)paVar17 + -8) = 0x4502c6;
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0xb68);
    }
    uVar10 = *(uint *)(aVar23.data + 0xc) >> 0x18 & 0xf;
    puVar11 = &switchD_0044ffca::switchdataD_006ea754;
    failure_msg = (int *)((long)&switchD_0044ffca::switchdataD_006ea754 +
                         (long)(int)(&switchD_0044ffca::switchdataD_006ea754)[uVar10]);
    aVar21 = this;
    aVar19 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
    table_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
    aVar24 = data_00;
    switch(uVar10) {
    case 0:
switchD_0044ffca_caseD_0:
      data_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
      *(undefined8 *)((long)paVar17 + -8) = 0x44ffd7;
      KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)aVar23,(KeyNode *)aVar24);
      break;
    case 1:
switchD_0044ffca_caseD_1:
      data_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
      *(undefined8 *)((long)paVar17 + -8) = 0x44fffe;
      KeyMapBase<unsigned_int>::InsertOrReplaceNode
                ((KeyMapBase<unsigned_int> *)aVar23,(KeyNode *)aVar24);
      break;
    case 2:
switchD_0044ffca_caseD_2:
      data_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
      *(undefined8 *)((long)paVar17 + -8) = 0x44ffe4;
      KeyMapBase<unsigned_long>::InsertOrReplaceNode
                ((KeyMapBase<unsigned_long> *)aVar23,(KeyNode *)aVar24);
      break;
    default:
      goto switchD_0044ffca_caseD_3;
    case 5:
switchD_0044ffca_caseD_5:
      data_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
      *(undefined8 *)((long)paVar17 + -8) = 0x44fff1;
      KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      InsertOrReplaceNode((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)aVar23,(KeyNode *)aVar24);
      break;
    case 6:
switchD_0044ffca_caseD_6:
      LOCK();
      uVar4 = *(undefined4 *)(this.data + (long)failure_msg);
      *(int *)(this.data + (long)failure_msg) = (int)failure_msg;
      failure_msg = (int *)CONCAT44((int)((ulong)failure_msg >> 0x20),uVar4);
      UNLOCK();
      *(char *)failure_msg = (char)*failure_msg + (char)uVar4;
      ptr = (char *)aVar23;
code_r0x004519bc:
      uVar10 = (uint)failure_msg & 0xf;
      puVar11 = &switchD_004519cd::switchdataD_006ea76c;
      uVar12 = (ulong)(int)(&switchD_004519cd::switchdataD_006ea76c)[uVar10];
      failure_msg = (int *)((long)&switchD_004519cd::switchdataD_006ea76c + uVar12);
      aVar23 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
      switch(uVar10) {
      case 0:
        paVar17[-1] = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x4519da;
        KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)ptr,(KeyNode *)data_00);
        break;
      case 1:
        paVar17[-1] = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x451a01;
        KeyMapBase<unsigned_int>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_int> *)ptr,(KeyNode *)data_00);
        break;
      case 2:
        goto code_r0x004519e2;
      default:
        goto switchD_004519cd_caseD_3;
      case 5:
switchD_0044ffca_caseD_7:
        pcVar20 = (char *)((long)puVar11 * 5 + -9);
        *pcVar20 = (*pcVar20 - (char)puVar11) - CARRY1((byte)this.data,(byte)((ulong)puVar11 >> 8));
        *(undefined8 *)((long)paVar17 + -8) = 0x4519f4;
        KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InsertOrReplaceNode
                  ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)ptr,(KeyNode *)data_00);
        ptr = (char *)aVar23;
        break;
      case 6:
        do {
          ptr = (char *)aVar19;
          aVar21 = this;
          aVar19 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
          table_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
          aVar24 = data_00;
          switch(failure_msg) {
          case (int *)0x44ffcc:
            goto switchD_0044ffca_caseD_0;
          case (int *)0x44ffd9:
            goto switchD_0044ffca_caseD_2;
          case (int *)0x44ffe6:
            goto switchD_0044ffca_caseD_5;
          case (int *)0x44fff3:
            goto switchD_0044ffca_caseD_1;
          case (int *)0x4502b5:
            goto switchD_0044ffca_caseD_3;
          case (int *)0x4519b7:
            goto switchD_0044ffca_caseD_6;
          case (int *)0x4519c4:
            goto switchD_0044ffca_caseD_8;
          case (int *)0x4519d1:
            goto switchD_0044ffca_caseD_b;
          case (int *)0x4519de:
            goto switchD_0044ffca_caseD_7;
          case (int *)0x451ca8:
            goto switchD_0044ffca_caseD_9;
          case (int *)0x451db0:
switchD_0044ffca_caseD_c:
            table = (TcParseTableBase *)aVar23;
            if ((long)puVar11 - 1U != 0) {
              pcVar20 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)0>
                                  (*(MessageLite **)paVar17,pcVar20,ctx_01,
                                   (TcFieldData)((long)puVar11 - 1U),(TcParseTableBase *)table_00,
                                   hasbits);
              return pcVar20;
            }
            puVar11 = (uint *)((ulong)ptr & 0xffffffff);
            this = (anon_union_8_1_898a9ca8_for_TcFieldData_0)paVar17[3].data;
            ctx_00 = *(ParseContext **)(paVar17 + 4);
            ctx = (ParseContext *)paVar17[5].data;
            paVar18 = paVar17 + 6;
            data_00 = paVar17[7];
            msg_00 = paVar17[8];
            paVar17 = paVar17 + 9;
            aVar19 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
            hasbits = aVar21.data;
            aVar23.data = paVar18->data;
            break;
          case (int *)0x451e38:
            goto switchD_0044ffca_caseD_e;
          case (int *)0x451e5d:
            goto switchD_0044ffca_caseD_f;
          case (int *)0x451e82:
            goto switchD_0044ffca_caseD_d;
          }
        } while( true );
      case 7:
        pcVar20 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                            ((MessageLite *)aVar19,pcVar20,ctx_01,(TcFieldData)0x6ea76c,table,
                             this.data);
        return pcVar20;
      case 8:
        goto code_r0x00451e5e;
      case 9:
        goto code_r0x00451e83;
      case 10:
        uVar12 = (long)(int)(uint)failure_msg * 0x6ea76c;
        if (((long)(int)uVar12 != uVar12) != (long)failure_msg < 0) {
          return (char *)(uVar12 & 0xffffffff);
        }
        pcVar9 = (code *)swi(0xff);
        uVar13 = (*pcVar9)();
        paVar17->data = uVar13;
      case 0xb:
        failure_msg = (int *)(ulong)(*(byte *)(aVar19.data + 0xf) & 0xf);
      case 0xf:
        if (5 < (uint)failure_msg) {
          paVar17[-1] = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                        cleanup::arena_destruct_object<std::__cxx11::string>;
          UntypedMapBase::
          VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                    ();
        }
        puVar11 = &switchD_00456044::switchdataD_006ea794;
code_r0x0045603d:
        pcVar20 = (char *)(*(code *)((long)(int)puVar11[(long)failure_msg] + (long)puVar11))();
        return pcVar20;
      case 0xc:
        if (SCARRY8(uVar12,0x6ea76c) != (long)failure_msg < 0) {
          return (char *)paVar17->data;
        }
        pcVar20 = (char *)((long)&UINT_006ea6f8 + uVar12 + 1);
        *pcVar20 = *pcVar20 + 'l' + (0xffffffffff915893 < uVar12);
        failure_msg = (int *)(ulong)((uint)failure_msg | 0x294757);
        goto code_r0x0045603d;
      case 0xd:
      case 0xe:
        *(int *)table = *(int *)table - (int)table;
        goto code_r0x0045603d;
      }
      goto LAB_00451a01;
    case 7:
      goto switchD_0044ffca_caseD_7;
    case 8:
      goto switchD_0044ffca_caseD_8;
    case 9:
    case 10:
switchD_0044ffca_caseD_9:
      iVar16 = 0x481;
LAB_00451cb0:
      *(undefined8 *)((long)paVar17 + -8) = 0x451cb8;
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)this,pcVar20,iVar16,(Nonnull<const_char_*>)failure_msg);
      *(undefined8 *)((long)paVar17 + -8) = 0x451cc0;
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)this);
    case 0xb:
      goto switchD_0044ffca_caseD_b;
    case 0xc:
      goto switchD_0044ffca_caseD_c;
    case 0xd:
switchD_0044ffca_caseD_d:
      this.data = hasbits;
code_r0x00451e83:
      pcVar20 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                          ((MessageLite *)aVar19,pcVar20,ctx_01,(TcFieldData)puVar11,table,this.data
                          );
      return pcVar20;
    case 0xe:
switchD_0044ffca_caseD_e:
      ptr = (char *)aVar23;
      goto code_r0x00451e5e;
    case 0xf:
switchD_0044ffca_caseD_f:
      data_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar11;
      ctx_00 = ctx_01;
      ctx = (ParseContext *)pcVar20;
      msg_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
      ptr = (char *)table;
      this.data = hasbits;
code_r0x00451e5e:
      pcVar20 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                          ((MessageLite *)msg_00,(char *)ctx,ctx_00,(TcFieldData)data_00,
                           (TcParseTableBase *)ptr,this.data);
      return pcVar20;
    }
LAB_0044fffe:
    if (*(ParseContext **)ctx <= ctx_00) {
      uVar12 = (ulong)**(ushort **)((long)paVar17 + 0x20);
      if (uVar12 == 0) {
        return (char *)ctx_00;
      }
      lVar14 = *(long *)((long)paVar17 + 0x30);
      goto LAB_004501b5;
    }
    bVar1 = *(byte *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
    uVar10 = (uint)bVar1;
    ptr = (char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 1);
    if ((char)bVar1 < '\0') {
      uVar15 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
      lVar14 = CONCAT71(uVar15,*ptr);
      if (*ptr < '\0') {
        uVar15 = uVar15 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
        cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2);
        lVar14 = CONCAT71(uVar15,cVar2);
        if (cVar2 < '\0') {
          uVar15 = uVar15 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
          cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3);
          lVar14 = CONCAT71(uVar15,cVar2);
          if (cVar2 < '\0') {
            uVar15 = uVar15 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
            cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4);
            if (cVar2 < '\0') {
              uVar10 = 0;
              ptr = (char *)0x0;
            }
            else {
              uVar10 = (int)CONCAT71(uVar15,cVar2) << 0x1c | (uint)(uVar15 >> 0x1c);
              ptr = (char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 5);
            }
          }
          else {
            uVar10 = (int)lVar14 << 0x15 | (uint)(uVar15 >> 0x23);
            ptr = (char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4);
          }
        }
        else {
          uVar10 = (int)lVar14 << 0xe | (uint)(uVar15 >> 0x2a);
          ptr = (char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3);
        }
      }
      else {
        uVar10 = (int)lVar14 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
        ptr = (char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2);
      }
    }
    table = (TcParseTableBase *)data_00;
  } while (uVar10 == *(uint *)((long)paVar17 + 0x38));
  if (ctx_00 < *(ParseContext **)ctx) {
    uVar3 = *(ushort *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
    lVar14 = *(long *)((long)paVar17 + 0x20);
    uVar10 = (uint)*(byte *)(lVar14 + 8) & (uint)uVar3;
    if ((uVar10 & 7) != 0) {
      *(code **)((long)paVar17 + -8) = MpVarint<true>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar12 = (ulong)(uVar10 & 0xfffffff8);
    pcVar20 = (char *)(**(code **)(lVar14 + 0x38 + uVar12 * 2))
                                (*(undefined8 *)((long)paVar17 + 0x30),ctx_00,ctx,
                                 (ulong)uVar3 ^ *(ulong *)(lVar14 + 0x40 + uVar12 * 2),lVar14,
                                 *(undefined8 *)((long)paVar17 + 0x28));
    return pcVar20;
  }
  uVar12 = (ulong)**(ushort **)((long)paVar17 + 0x20);
  lVar14 = *(long *)((long)paVar17 + 0x30);
  if (uVar12 != 0) {
LAB_004501b5:
    puVar11 = (uint *)(lVar14 + uVar12);
    if (((ulong)puVar11 & 3) != 0) goto LAB_00450255;
    *puVar11 = *puVar11 | (uint)*(undefined8 *)((long)paVar17 + 0x28);
  }
  return (char *)ctx_00;
switchD_0044ffca_caseD_b:
  data_00.data = (ulong)ptr & 0xffffffff;
code_r0x004519e2:
  *(undefined8 *)((long)paVar17 + -8) = 0x4519e7;
  KeyMapBase<unsigned_long>::InsertOrReplaceNode
            ((KeyMapBase<unsigned_long> *)ptr,(KeyNode *)data_00);
  ptr = (char *)aVar23;
LAB_00451a01:
  do {
    if (*(ParseContext **)ctx <= ctx_00) {
      uVar12 = (ulong)*(ushort *)paVar17[4];
      if (uVar12 == 0) {
        return (char *)ctx_00;
      }
      uVar22 = paVar17[6].data;
LAB_00451bb8:
      puVar11 = (uint *)(uVar22 + uVar12);
      if (((ulong)puVar11 & 3) == 0) {
        *puVar11 = *puVar11 | (uint)(NodeBase **)paVar17[5].data;
        return (char *)ctx_00;
      }
      paVar17[-1].data = 0x451c86;
      AlignFail();
    }
    bVar1 = *(byte *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
    uVar10 = (uint)bVar1;
    aVar19.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 1;
    if ((char)bVar1 < '\0') {
      uVar15 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
      lVar14 = CONCAT71(uVar15,*(char *)aVar19);
      if (*(char *)aVar19 < '\0') {
        uVar15 = uVar15 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
        cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2);
        lVar14 = CONCAT71(uVar15,cVar2);
        if (cVar2 < '\0') {
          uVar15 = uVar15 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
          cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3);
          lVar14 = CONCAT71(uVar15,cVar2);
          if (cVar2 < '\0') {
            uVar15 = uVar15 >> 7 | (uint7)((ulong)(lVar14 << 0x39) >> 8);
            cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4);
            if (cVar2 < '\0') {
              uVar10 = 0;
              aVar19.data = 0;
            }
            else {
              uVar10 = (int)CONCAT71(uVar15,cVar2) << 0x1c | (uint)(uVar15 >> 0x1c);
              aVar19.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 5;
            }
          }
          else {
            uVar10 = (int)lVar14 << 0x15 | (uint)(uVar15 >> 0x23);
            aVar19.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4;
          }
        }
        else {
          uVar10 = (int)lVar14 << 0xe | (uint)(uVar15 >> 0x2a);
          aVar19.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3;
        }
      }
      else {
        uVar10 = (int)lVar14 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
        aVar19.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2;
      }
    }
    if (uVar10 != *(uint *)(paVar17 + 7)) {
      if (ctx_00 < *(ParseContext **)ctx) {
        uVar3 = *(ushort *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
        pOVar8 = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                  *)paVar17[4].data;
        uVar10 = (uint)*(byte *)&(pOVar8->super_anon_class_16_2_4417ab01).aux & (uint)uVar3;
        if ((uVar10 & 7) != 0) {
          paVar17[-1].data = (uint64_t)&UNK_00451ce9;
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar12 = (ulong)(uVar10 & 0xfffffff8);
        pcVar20 = (char *)(**(code **)((long)&pOVar8[2].super_anon_class_16_2_4417ab01.aux +
                                      uVar12 * 2))
                                    (paVar17[6].data,ctx_00,ctx,
                                     (ulong)uVar3 ^
                                     *(ulong *)((long)&pOVar8[2].super_anon_class_16_2_4417ab01.map
                                               + uVar12 * 2),pOVar8,(NodeBase **)paVar17[5].data);
        return pcVar20;
      }
      uVar12 = (ulong)*(ushort *)paVar17[4];
      uVar22 = paVar17[6].data;
      if (uVar12 == 0) {
        return (char *)ctx_00;
      }
      goto LAB_00451bb8;
    }
    pcVar20._2_6_ = 0;
    pcVar20._0_2_ = *(ushort *)((long)ptr + 0xc);
    paVar17[-1].data = 0x4517f8;
    data_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
              UntypedMapBase::AllocNode((UntypedMapBase *)ptr,(size_t)pcVar20);
    uVar3 = *(ushort *)((long)ptr + 0xc);
    uVar12 = (ulong)uVar3 - 8;
    if (uVar12 < 8) {
      pcVar20 = &DAT_00000008;
      paVar17[-1].data = 0x451a40;
      failure_msg = (int *)absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                                     (uVar12,8,
                                      "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)")
      ;
    }
    else {
      failure_msg = (int *)0x0;
    }
    if (failure_msg != (int *)0x0) {
      pcVar20 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      this.data = (uint64_t)(paVar17 + 9);
      iVar16 = 0xb2c;
      goto LAB_00451cb0;
    }
    *(char **)(data_00.data + 8) = (char *)0x0;
    *(undefined8 *)((long)(data_00.data - 8) + (ulong)uVar3) = 0;
    paVar17[0x10].data = (uint64_t)ptr;
    paVar17[0xd].data = (uint64_t)data_00;
    paVar17[9].data = (uint64_t)ptr;
    this.data = (uint64_t)(paVar17 + 0x10);
    paVar17[10].data = (uint64_t)this;
    paVar17[0xb].data = (uint64_t)msg_00;
    paVar17[2].data = (uint64_t)msg_00;
    *paVar17 = paVar17[9];
    paVar17[1] = paVar17[10];
    paVar17[-1].data = 0x45185e;
    UntypedMapBase::
    VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)ptr,*(anon_class_24_3_6b4a22af *)paVar17);
    paVar17[0x10].data = (uint64_t)ptr;
    paVar17[0x11].data = (uint64_t)(paVar17 + 8);
    paVar17[0x12].data = (uint64_t)ptr;
    paVar17[0xd].data = (uint64_t)data_00;
    paVar17[9].data = (uint64_t)ptr;
    paVar17[10].data = (uint64_t)this;
    paVar17[0xb].data = (uint64_t)msg_00;
    paVar17[2].data = (uint64_t)msg_00;
    *paVar17 = paVar17[9];
    paVar17[1] = paVar17[10];
    paVar17[-1].data = 0x4518a5;
    aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)ptr,*(anon_class_24_3_6b4a22af *)paVar17);
    bVar1 = *(byte *)aVar19;
    aVar23.data._1_7_ = 0;
    aVar23.data._0_1_ = bVar1;
    if ((char)bVar1 < '\0') {
      pcVar20._4_4_ = 0;
      pcVar20._0_4_ = CONCAT31(0,bVar1);
      paVar17[-1].data = 0x4518bd;
      pVar26 = ReadSizeFallback((char *)aVar19,CONCAT31(0,bVar1));
      aVar23.data = pVar26._8_8_ & 0xffffffff;
    }
    else {
      pVar26._8_8_ = extraout_RDX_04;
      pVar26.first = (char *)(aVar19.data + 1);
      aVar19 = aVar21;
    }
    ctx_01 = pVar26._8_8_;
    aVar21.data = (uint64_t)pVar26.first;
    if (((EpsCopyInputStream *)aVar21.data == (EpsCopyInputStream *)0x0) ||
       (*(int *)((long)ctx + 0x58) < 1)) {
      aVar21.data = 0;
    }
    else {
      aVar19.data = (uint64_t)(paVar17 + 9);
      paVar17[-1].data = 0x4518de;
      pcVar20 = (char *)ctx;
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)aVar19,(char *)ctx,(int)pVar26.first);
      *(undefined4 *)((long)paVar17 + 100) = *(undefined4 *)(paVar17 + 9);
      *(int *)((long)ctx + 0x58U) = *(int *)((long)ctx + 0x58U) + -1;
      ctx_01 = extraout_RDX_05;
    }
    if ((EpsCopyInputStream *)aVar21.data == (EpsCopyInputStream *)0x0) {
LAB_00451963:
      ctx_00 = (ParseContext *)0x0;
    }
    else {
      iVar16 = *(int *)((long)ctx + 0x58);
      this = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)iVar16;
      aVar23 = paVar17[8];
      paVar17->data = (uint64_t)ptr;
      table = *(TcParseTableBase **)(paVar17 + 4);
      hasbits = *(uint64_t *)(paVar17 + 0xf);
      paVar17[-1].data = 0x451919;
      aVar19 = data_00;
      ctx_00 = (ParseContext *)
               ParseOneMapEntry((NodeBase *)data_00,(char *)aVar21,ctx,(FieldAux *)aVar23,table,
                                (FieldEntry *)hasbits,*(UntypedMapBase **)paVar17);
      ctx_01 = extraout_RDX_06;
      if (ctx_00 != (ParseContext *)0x0) {
        aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*(int *)((long)ctx + 0x58);
        if (iVar16 == *(int *)((long)ctx + 0x58)) {
          failure_msg = (int *)0x0;
        }
        else {
          paVar17[-1].data = 0x451ab3;
          aVar19 = this;
          failure_msg = (int *)absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                         (this.data,aVar21.data,"old_depth == depth_");
          ctx_01 = extraout_RDX_07;
        }
        if (failure_msg != (int *)0x0) {
          pcVar20 = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
          ;
          this.data = (uint64_t)(paVar17 + 9);
          goto switchD_0044ffca_caseD_9;
        }
      }
      *(int *)((long)ctx + 0x58U) = *(int *)((long)ctx + 0x58U) + 1;
      uVar10 = *(int *)((long)ctx + 0x1c) + *(int *)((long)paVar17 + 100);
      *(uint *)((long)ctx + 0x1c) = uVar10;
      pcVar20 = (char *)aVar21;
      if (*(int *)((long)ctx + 0x50) != 0) goto LAB_00451963;
      aVar23._0_4_ = (int)uVar10 >> 0x1f & uVar10;
      aVar23.data._4_4_ = 0;
      *(long *)ctx = (long)(int)aVar23._0_4_ + *(long *)((long)ctx + 8);
    }
    if (ctx_00 == (ParseContext *)0x0) {
      if (*(long *)((long)ptr + 0x18) == 0) {
        paVar17[-1].data = 0x451bf3;
        UntypedMapBase::DeleteNode((UntypedMapBase *)ptr,(NodeBase *)data_00);
        ctx_01 = extraout_RDX_08;
        pcVar20 = (char *)data_00;
      }
      pcVar20 = Error((MessageLite *)paVar17[6],pcVar20,ctx_01,(TcFieldData)aVar23,
                      (TcParseTableBase *)paVar17[4],(uint64_t)paVar17[5].data);
      return pcVar20;
    }
    if ((*(byte *)((long)paVar17 + 0x1f) & 0x10) == 0) goto LAB_004519a7;
    paVar17[-1].data = 0x451981;
    puVar11 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)ptr,(NodeBase *)data_00);
    uVar10 = *puVar11;
    pNVar7 = ((NodeBase **)paVar17[8].data)[1];
    pcVar20 = (char *)(long)(short)*(uint *)&pNVar7->next;
    aVar19.data._0_4_ = *(uint *)&pNVar7->next >> 0x10;
    aVar19.data._4_4_ = 0;
    ctx_01 = (ParseContext *)(((long)(int)uVar10 - (long)pcVar20) - (long)aVar19);
    if ((EpsCopyInputStream *)((long)(int)uVar10 - (long)pcVar20) < aVar19.data) goto LAB_004519a7;
    uVar5 = *(uint *)((long)&pNVar7->next + 4);
    pcVar20._4_4_ = 0;
    pcVar20._0_4_ = uVar5;
    aVar19.data._2_6_ = 0;
    aVar19.data._0_2_ = (ushort)uVar5;
    if (ctx_01 < (ulong)aVar19) {
      aVar19.data._1_1_ = (char)(uVar5 >> 8);
      aVar19.data._0_1_ =
           (*(uint *)((long)&pNVar7[1].next + ((ulong)ctx_01 >> 5) * 4) >> ((uint)ctx_01 & 0x1f) & 1
           ) != 0;
      aVar19.data._2_6_ = 0;
    }
    else {
      ctx_01 = (ParseContext *)(ulong)(uVar5 >> 0x10);
      aVar23.data = 0;
      while (pcVar20 = (char *)aVar23, aVar19._1_7_ = (undefined7)((ulong)aVar19 >> 8),
            aVar19.data._0_1_ = pcVar20 < ctx_01, pcVar20 < ctx_01) {
        uVar6 = *(uint *)((long)&pNVar7[1].next + (long)pcVar20 * 4 + (ulong)(uVar5 >> 3 & 0x1ffc));
        aVar19.data._4_4_ = 0;
        aVar19.data._0_4_ = uVar6;
        hasbits._1_7_ = 0;
        hasbits._0_1_ = (int)uVar10 < (int)uVar6;
        table = (TcParseTableBase *)(((long)pcVar20 * 2 - hasbits) + 2);
        aVar23.data = (uint64_t)table;
        if (uVar6 == uVar10) goto LAB_004519a7;
      }
    }
    if ((char)aVar19.data != '\0') goto LAB_004519a7;
    hasbits = paVar17[0xe].data;
    paVar17[-1].data = 0x451a9f;
    WriteMapEntryAsUnknown
              ((MessageLite *)paVar17[6],(TcParseTableBase *)paVar17[4],(UntypedMapBase *)ptr,
               (uint32_t)
               (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)paVar17[7].data,(NodeBase *)data_00,SUB85(hasbits,0));
    table = (TcParseTableBase *)data_00;
  } while( true );
switchD_0044ffca_caseD_8:
  *failure_msg = *failure_msg - (int)failure_msg;
  ptr = (char *)aVar23;
  goto code_r0x004519bc;
LAB_004519a7:
  failure_msg = (int *)(ulong)(*(uint *)((long)ptr + 0xc) >> 0x18);
  if (5 < ((byte)(*(uint *)((long)ptr + 0xc) >> 0x18) & 0xf)) {
switchD_004519cd_caseD_3:
    *(undefined8 *)((long)paVar17 + -8) = 0x451cd1;
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0xb68);
  }
  goto code_r0x004519bc;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMap(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // `aux[0]` points into a MapAuxInfo.
  // If we have a message mapped_type aux[1] points into a `create_in_arena`.
  // If we have a validated enum mapped_type aux[1] point into a
  // `enum_data`.
  const auto* aux = table->field_aux(&entry);
  const auto map_info = aux[0].map_info;

  if (ABSL_PREDICT_FALSE(!map_info.is_supported ||
                         (data.tag() & 7) !=
                             WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    PROTOBUF_MUSTTAIL return MpFallback(PROTOBUF_TC_PARAM_PASS);
  }

  // When using LITE, the offset points directly into the Map<> object.
  // Otherwise, it points into a MapField and we must synchronize with
  // reflection. It is done by calling the MutableMap() virtual function on the
  // field's base class.
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  UntypedMapBase& map =
      map_info.use_lite
          ? RefAt<UntypedMapBase>(base, entry.offset)
          : *RefAt<MapFieldBaseForParse>(base, entry.offset).MutableMap();

  const uint32_t saved_tag = data.tag();

  while (true) {
    NodeBase* node = map.AllocNode();
    char* const node_end =
        reinterpret_cast<char*>(node) + map.type_info().node_size;
    void* const node_key = node->GetVoidKey();

    // Due to node alignment we can guarantee that we have at least 8 writable
    // bytes from the key position to the end of the node.
    // We can initialize the first and last 8 bytes, which takes care of all the
    // scalar value types. This makes the VisitXXX calls below faster because
    // the switch is much smaller.
    // Assert this in debug mode, just in case.
    ABSL_DCHECK_GE(node_end - static_cast<char*>(node_key), sizeof(uint64_t));
    memset(node_key, 0, sizeof(uint64_t));
    memset(node_end - sizeof(uint64_t), 0, sizeof(uint64_t));

    map.VisitKey(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    map.VisitValue(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  [&](MessageLite* msg) {
                    aux[1].table->class_data->PlacementNew(msg, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
      return ParseOneMapEntry(node, ptr, ctx, aux, table, entry, map);
    });

    if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
      // Parsing failed. Delete the node that we didn't insert.
      if (map.arena() == nullptr) map.DeleteNode(node);
      PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    if (ABSL_PREDICT_FALSE(
            map_info.value_is_validated_enum &&
            !internal::ValidateEnumInlined(*map.GetValue<int32_t>(node),
                                           aux[1].enum_data))) {
      WriteMapEntryAsUnknown(msg, table, map, saved_tag, node, map_info);
    } else {
      // Done parsing the node, insert it.
      switch (map.type_info().key_type_kind()) {
        case UntypedMapBase::TypeKind::kBool:
          static_cast<KeyMapBase<bool>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<bool>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU32:
          static_cast<KeyMapBase<uint32_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint32_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU64:
          static_cast<KeyMapBase<uint64_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint64_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kString:
          static_cast<KeyMapBase<std::string>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<std::string>::KeyNode*>(node));
          break;
        default:
          Unreachable();
      }
    }

    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) {
      PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    uint32_t next_tag;
    const char* ptr2 = ReadTagInlined(ptr, &next_tag);
    if (next_tag != saved_tag) break;
    ptr = ptr2;
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}